

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<char> local_99;
  string local_98;
  uint8_t local_78 [4];
  uint local_74;
  uint8_t local_70 [4];
  uint8_t local_6c;
  uint8_t local_68 [4];
  uint local_64;
  uint8_t local_5c [4];
  uint8_t local_58;
  uint8_t local_48 [4];
  uint local_44;
  uint8_t local_40 [4];
  uint8_t local_3c;
  undefined1 local_38 [8];
  TGAImage image;
  
  image._36_4_ = 0;
  TGAImage::TGAImage((TGAImage *)local_38,300,300,3);
  local_3c = white.bytespp;
  local_40[0] = white.bgra[0];
  local_40[1] = white.bgra[1];
  local_40[2] = white.bgra[2];
  local_40[3] = white.bgra[3];
  local_44 = CONCAT31(local_44._1_3_,white.bytespp);
  local_48[0] = white.bgra[0];
  local_48[1] = white.bgra[1];
  local_48[2] = white.bgra[2];
  local_48[3] = white.bgra[3];
  line_attempt_5(-100,-100,500,500,(TGAImage *)local_38,
                 (TGAColor)((uint5)(uint)white.bgra | (uint5)local_44 << 0x20));
  local_58 = white.bytespp;
  local_5c[0] = white.bgra[0];
  local_5c[1] = white.bgra[1];
  local_5c[2] = white.bgra[2];
  local_5c[3] = white.bgra[3];
  local_64 = CONCAT31(local_64._1_3_,white.bytespp);
  local_68[0] = white.bgra[0];
  local_68[1] = white.bgra[1];
  local_68[2] = white.bgra[2];
  local_68[3] = white.bgra[3];
  line_attempt_5(0x28,0x28,0x3c,0x104,(TGAImage *)local_38,
                 (TGAColor)((uint5)(uint)white.bgra | (uint5)local_64 << 0x20));
  local_6c = white.bytespp;
  local_70[0] = white.bgra[0];
  local_70[1] = white.bgra[1];
  local_70[2] = white.bgra[2];
  local_70[3] = white.bgra[3];
  local_74 = CONCAT31(local_74._1_3_,white.bytespp);
  local_78[0] = white.bgra[0];
  local_78[1] = white.bgra[1];
  local_78[2] = white.bgra[2];
  local_78[3] = white.bgra[3];
  line_attempt_5(0x28,0x28,0x104,0x3c,(TGAImage *)local_38,
                 (TGAColor)((uint5)(uint)white.bgra | (uint5)local_74 << 0x20));
  TGAImage::flip_vertically((TGAImage *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"output.tga",&local_99);
  TGAImage::write_tga_file((TGAImage *)local_38,&local_98,true,true);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  image._36_4_ = 0;
  TGAImage::~TGAImage((TGAImage *)local_38);
  return image._36_4_;
}

Assistant:

int main()
{
    TGAImage image(300, 300, TGAImage::RGB);

    line_attempt_5(-100, -100, 500, 500, image, white);
    line_attempt_5(40, 40, 60, 260, image, white);
    line_attempt_5(40, 40, 260, 60, image, white);

    image.flip_vertically();  // i want to have the origin at the left bottom corner of the image
    image.write_tga_file("output.tga");
    return 0;
}